

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

void __thiscall
graphics101::HalfEdgeTriMesh::vertex_vertex_neighbors
          (HalfEdgeTriMesh *this,Index vertex_index,Indices *result)

{
  long lVar1;
  HalfEdge *pHVar2;
  Index *pIVar3;
  HalfEdge *he;
  HalfEdgeIndex hei;
  HalfEdgeIndex start_hei;
  Indices *result_local;
  Index vertex_index_local;
  HalfEdgeTriMesh *this_local;
  
  std::vector<long,_std::allocator<long>_>::clear(result);
  he = (HalfEdge *)outgoing_halfedge_index_for_vertex(this,vertex_index);
  hei = (HalfEdgeIndex)he;
  do {
    pHVar2 = halfedge(this,(HalfEdgeIndex *)&he);
    std::vector<long,_std::allocator<long>_>::push_back(result,&pHVar2->to_vertex);
    pHVar2 = halfedge(this,&pHVar2->opposite_he);
    he = (HalfEdge *)(pHVar2->next_he).value;
    pIVar3 = HalfEdgeIndex::operator_cast_to_long_((HalfEdgeIndex *)&he);
    lVar1 = *pIVar3;
    pIVar3 = HalfEdgeIndex::operator_cast_to_long_(&hei);
  } while (lVar1 != *pIVar3);
  return;
}

Assistant:

void HalfEdgeTriMesh::vertex_vertex_neighbors( const Index vertex_index, Indices& result ) const
{
    result.clear();

    // Get the outgoing half-edge index for the vertex.
    const HalfEdgeIndex start_hei = outgoing_halfedge_index_for_vertex( vertex_index );
    // Start the iteration at that half-edge index.
    HalfEdgeIndex hei = start_hei;
    while( true )
    {
        // Get the HalfEdge for the half-edge index.
        const HalfEdge& he = halfedge( hei );
        // Store the vertex the half-edge points to.
        result.push_back( he.to_vertex );

        // Increment to the next vertex.
        hei = halfedge( he.opposite_he ).next_he;

        // If we are back where we started, we've seen all vertices.
        if( hei == start_hei ) break;
    }
}